

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestGetTickCount(void)

{
  return true;
}

Assistant:

bool TestGetTickCount()
{
    // Example from README:
    {
        //Counter32 t = ::GetTickCount();
        Counter32 t = 0xffffff00;
        Counter32 kTimeout = t + 300; // Wait for 300 ms
	    // kTimeout == 0x0000002c here.

        unsigned loops = 0;
        while (t < kTimeout)
        {
		    //::Sleep(10);
		    //t = ::GetTickCount();
		    t += 10;
            ++loops;
        }

        TEST_CHECK(loops == 30);
        TEST_CHECK(t == 0x0000002c);
    }

    //Counter32 t0 = ::GetTickCount();
    Counter32 t0 = 0xffffff00;
    Counter32 kTimeout = t0 + 300;

    Counter32 t = t0;
    unsigned loops = 0;
    do
    {
        ++loops;
        TEST_CHECK(loops <= 30);

        //::Sleep(10);
        t += 10;

    } while (t < kTimeout);

    TEST_CHECK(loops == 30);

    //Counter32 t1 = ::GetTickCount();
    Counter32 t1 = 0x0000002c;

    TEST_CHECK(t == t1);

    // Test the cases where normal integers fall down:

    TEST_CHECK(t1 > t0);
    TEST_CHECK(t1 >= t0);
    TEST_CHECK(t0 < t1);

    // Test some other common ways to check for an elapsed timer:

    TEST_CHECK(t1 - t0 > 299);
    TEST_CHECK(t1 - t0 >= 300);
    TEST_CHECK(t1 - t0 < 301);

    TEST_CHECK(t1 > t0 + 299);
    TEST_CHECK(t1 >= t0 + 300);
    TEST_CHECK(t1 < t0 + 301);

    TEST_CHECK(t1 - 299 > t0);
    TEST_CHECK(t1 - 300 >= t0);
    TEST_CHECK(t1 - 301 < t0);

    return true;
}